

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlCopyDoc(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_50;
  undefined4 local_44;
  undefined *puStack_40;
  int recursive;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  xmlDocPtr c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"Oi:xmlCopyDoc",&stack0xffffffffffffffc0,&local_44);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (puStack_40 == &_Py_NoneStruct) {
      local_50 = (PyObject *)0x0;
    }
    else {
      local_50 = *(PyObject **)(puStack_40 + 0x10);
    }
    pyobj_doc = local_50;
    doc = (xmlDocPtr)xmlCopyDoc(local_50,local_44);
    self_local = libxml_xmlDocPtrWrap(doc);
  }
  return self_local;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlCopyDoc(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlDocPtr c_retval;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    int recursive;

    if (!PyArg_ParseTuple(args, (char *)"Oi:xmlCopyDoc", &pyobj_doc, &recursive))
        return(NULL);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);

    c_retval = xmlCopyDoc(doc, recursive);
    py_retval = libxml_xmlDocPtrWrap((xmlDocPtr) c_retval);
    return(py_retval);
}